

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_options.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json_options<wchar_t>::basic_json_options(basic_json_options<wchar_t> *this)

{
  basic_json_options_common<wchar_t>::basic_json_options_common
            ((basic_json_options_common<wchar_t> *)
             &(this->super_basic_json_decode_options<wchar_t>).field_0x70);
  basic_json_decode_options<wchar_t>::basic_json_decode_options
            (&this->super_basic_json_decode_options<wchar_t>,&PTR_construction_vtable_24__009a1140);
  basic_json_encode_options<wchar_t>::basic_json_encode_options
            ((basic_json_encode_options<wchar_t> *)
             &(this->super_basic_json_decode_options<wchar_t>).field_0x30,
             &PTR_construction_vtable_24__009a1150);
  (this->super_basic_json_decode_options<wchar_t>)._vptr_basic_json_decode_options =
       (_func_int **)0x9a10d8;
  *(undefined8 *)&(this->super_basic_json_decode_options<wchar_t>).field_0x70 = 0x9a1128;
  *(undefined8 *)&(this->super_basic_json_decode_options<wchar_t>).field_0x30 = 0x9a1100;
  return;
}

Assistant:

basic_json_options() = default;